

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InprocComms.cpp
# Opt level: O2

void __thiscall
helics::inproc::InprocComms::loadNetworkInfo(InprocComms *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  
  CommsInterface::loadNetworkInfo(&this->super_CommsInterface,netInfo);
  bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
  if (bVar1) {
    if ((this->super_CommsInterface).localTargetAddress._M_string_length == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(this->super_CommsInterface).localTargetAddress,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(this->super_CommsInterface).name);
    }
    CommsInterface::propertyUnLock(&this->super_CommsInterface);
    return;
  }
  return;
}

Assistant:

void InprocComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
    {
        CommsInterface::loadNetworkInfo(netInfo);
        if (!propertyLock()) {
            return;
        }
        // brokerPort = netInfo.brokerPort;
        // PortNumber = netInfo.portNumber;
        if (localTargetAddress.empty()) {
            localTargetAddress = name;
        }

        // if (PortNumber > 0)
        //{
        //    autoPortNumber = false;
        //}
        propertyUnLock();
    }